

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O0

int Potassco::xconvert<Clasp::Cli::ConfigKey,unsigned_int>
              (char *x,pair<Clasp::Cli::ConfigKey,_unsigned_int> *out,char **errPos,int sep)

{
  int iVar1;
  char **errPos_00;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  char **in_RDI;
  int sum;
  int tokU;
  int tokT;
  int ps;
  char *n;
  pair<Clasp::Cli::ConfigKey,_unsigned_int> temp;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 local_4;
  
  if (in_RDI == (char **)0x0) {
    local_4 = 0;
  }
  else {
    if (in_ECX == 0) {
      in_ECX = 0x2c;
    }
    uVar3 = (undefined4)*in_RSI;
    uVar4 = (undefined4)((ulong)*in_RSI >> 0x20);
    errPos_00 = in_RDI;
    if (*(char *)in_RDI == '(') {
      errPos_00 = (char **)((long)in_RDI + 1);
    }
    uVar2 = (uint)(*(char *)in_RDI == '(');
    iVar1 = Clasp::Cli::xconvert
                      ((char *)CONCAT44(in_ECX,uVar4),
                       (ConfigKey *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),errPos_00,uVar2);
    if (((iVar1 == 0) || (*(char *)errPos_00 != (char)in_ECX)) ||
       (*(char *)((long)errPos_00 + 1) == '\0')) {
      iVar1 = 0;
    }
    else {
      iVar1 = xconvert((char *)errPos_00,(uint *)CONCAT44(uVar2,iVar1),
                       (char **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb4);
    }
    local_4 = 0;
    if ((uVar2 == 0) || (*(char *)errPos_00 == ')')) {
      errPos_00 = (char **)((long)errPos_00 + (long)(int)uVar2);
      if (iVar1 != 0) {
        *(undefined4 *)((long)in_RSI + 4) = uVar4;
      }
      local_4 = (uint)(iVar1 != 0);
      if ((iVar1 != 0) || (*(char *)errPos_00 == '\0')) {
        *(undefined4 *)in_RSI = uVar3;
        local_4 = local_4 + 1;
      }
    }
    if (local_4 == 0) {
      errPos_00 = in_RDI;
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = errPos_00;
    }
  }
  return local_4;
}

Assistant:

int xconvert(const char* x, std::pair<T, U>& out, const char** errPos = 0, int sep = def_sep) {
	if (!x) { return 0; }
	if (sep == 0) { sep = def_sep; }
	std::pair<T, U> temp(out);
	const char* n = x;
	int ps = 0;
	if (*n == '(') { ++ps; ++n; }
	int tokT = xconvert(n, temp.first, &n, sep);
	int tokU = tokT && *n == (char)sep && n[1] ? xconvert(n+1, temp.second, &n, sep) : 0;
	int sum  = 0;
	if (!ps || *n == ')') {
		n += ps;
		if (tokU)        { out.second= temp.second; ++sum; }
		if (tokU || !*n) { out.first = temp.first; ++sum; }
	}
	if (!sum) { n = x; }
	if (errPos) *errPos = n;
	return sum;
}